

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileScalarOperation<false,duckdb::QuantileStandardType>::
     Window<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::hugeint_t,duckdb::hugeint_t>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t ridx)

{
  data_ptr_t pdVar1;
  bool bVar2;
  CursorType *data;
  idx_t n;
  FunctionData *pFVar3;
  reference q;
  type this;
  WindowQuantileState<duckdb::hugeint_t> *this_00;
  hugeint_t hVar4;
  QuantileIncluded<duckdb::hugeint_t> included;
  QuantileIncluded<duckdb::hugeint_t> local_40;
  
  data = QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                   ((QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)l_state,
                    partition);
  local_40.fmask = partition->filter_mask;
  local_40.dmask = data;
  n = QuantileOperation::FrameSize<duckdb::hugeint_t>(&local_40,frames);
  pFVar3 = optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
  pdVar1 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (n == 0) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>,ridx);
  }
  else {
    q = vector<duckdb::QuantileValue,_true>::get<true>
                  ((vector<duckdb::QuantileValue,_true> *)(pFVar3 + 1),0);
    if ((g_state != (const_data_ptr_t)0x0) &&
       (bVar2 = QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType>::HasTree
                          ((QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)g_state
                          ), bVar2)) {
      this = unique_ptr<duckdb::WindowQuantileState<duckdb::hugeint_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::hugeint_t>_>,_true>
             ::operator*((unique_ptr<duckdb::WindowQuantileState<duckdb::hugeint_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::hugeint_t>_>,_true>
                          *)(g_state + 0x18));
      hVar4 = WindowQuantileState<duckdb::hugeint_t>::WindowScalar<duckdb::hugeint_t,false>
                        (this,data,frames,n,result,q);
      *(uint64_t *)(pdVar1 + ridx * 0x10) = hVar4.lower;
      *(int64_t *)(pdVar1 + ridx * 0x10 + 8) = hVar4.upper;
      return;
    }
    this_00 = QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                        ((QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)l_state);
    WindowQuantileState<duckdb::hugeint_t>::UpdateSkip(this_00,data,frames,&local_40);
    hVar4 = WindowQuantileState<duckdb::hugeint_t>::WindowScalar<duckdb::hugeint_t,false>
                      (this_00,data,frames,n,result,q);
    *(uint64_t *)(pdVar1 + ridx * 0x10) = hVar4.lower;
    *(int64_t *)(pdVar1 + ridx * 0x10 + 8) = hVar4.upper;
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
              (&(this_00->prevs).
                super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>,
               &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>);
  }
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t ridx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);

		if (!n) {
			rmask.Set(ridx, false);
			return;
		}

		const auto &quantile = bind_data.quantiles[0];
		if (gstate && gstate->HasTree()) {
			rdata[ridx] = gstate->GetWindowState().template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result,
			                                                                                    quantile);
		} else {
			auto &window_state = state.GetOrCreateWindowState();

			//	Update the skip list
			window_state.UpdateSkip(data, frames, included);

			// Find the position(s) needed
			rdata[ridx] = window_state.template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result, quantile);

			//	Save the previous state for next time
			window_state.prevs = frames;
		}
	}